

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O0

void __thiscall icu_63::CurrencyPluralInfo::deleteHash(CurrencyPluralInfo *this,Hashtable *hTable)

{
  Hashtable *this_00;
  UHashElement *pUVar1;
  int32_t *pos_00;
  UnicodeString *value;
  UHashTok valueTok;
  UHashElement *element;
  Hashtable *pHStack_18;
  int32_t pos;
  Hashtable *hTable_local;
  CurrencyPluralInfo *this_local;
  
  if (hTable != (Hashtable *)0x0) {
    element._4_4_ = 0xffffffff;
    pHStack_18 = hTable;
    hTable_local = (Hashtable *)this;
    while( true ) {
      pos_00 = (int32_t *)((long)&element + 4);
      pUVar1 = Hashtable::nextElement(pHStack_18,pos_00);
      this_00 = pHStack_18;
      if (pUVar1 == (UHashElement *)0x0) break;
      if ((long *)(pUVar1->value).pointer != (long *)0x0) {
        (**(code **)(*(pUVar1->value).pointer + 8))();
      }
    }
    if (pHStack_18 != (Hashtable *)0x0) {
      Hashtable::~Hashtable(pHStack_18);
      UMemory::operator_delete((UMemory *)this_00,pos_00);
    }
  }
  return;
}

Assistant:

void
CurrencyPluralInfo::deleteHash(Hashtable* hTable) {
    if ( hTable == nullptr ) {
        return;
    }
    int32_t pos = UHASH_FIRST;
    const UHashElement* element = nullptr;
    while ( (element = hTable->nextElement(pos)) != nullptr ) {
        const UHashTok valueTok = element->value;
        const UnicodeString* value = (UnicodeString*)valueTok.pointer;
        delete value;
    }
    delete hTable;
    hTable = nullptr;
}